

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

size_t union_uint16(uint16_t *set_1,size_t size_1,uint16_t *set_2,size_t size_2,uint16_t *buffer)

{
  ulong uVar1;
  ulong in_RCX;
  ushort *in_RDX;
  ulong in_RSI;
  ushort *in_RDI;
  void *in_R8;
  size_t n_elems_1;
  size_t n_elems;
  uint16_t val_2;
  uint16_t val_1;
  size_t idx_2;
  size_t idx_1;
  size_t pos;
  ushort local_4c;
  ushort local_4a;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  size_t local_8;
  
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  if (in_RCX == 0) {
    memmove(in_R8,in_RDI,in_RSI << 1);
    local_8 = in_RSI;
  }
  else {
    if (in_RSI != 0) {
      local_4a = *in_RDI;
      local_4c = *in_RDX;
      do {
        if (local_4a < local_4c) {
          *(ushort *)((long)in_R8 + local_38 * 2) = local_4a;
          local_40 = local_40 + 1;
          uVar1 = local_48;
          if (in_RSI <= local_40) goto LAB_001073d3;
          local_4a = in_RDI[local_40];
        }
        else {
          if (local_4c < local_4a) {
            *(ushort *)((long)in_R8 + local_38 * 2) = local_4c;
            uVar1 = local_48 + 1;
            if (in_RCX <= uVar1) goto LAB_001073d3;
            local_4c = in_RDX[uVar1];
          }
          else {
            *(ushort *)((long)in_R8 + local_38 * 2) = local_4a;
            local_40 = local_40 + 1;
            uVar1 = local_48 + 1;
            if ((in_RSI <= local_40) || (in_RCX <= uVar1)) {
LAB_001073d3:
              local_48 = uVar1;
              local_38 = local_38 + 1;
              if (local_40 < in_RSI) {
                memmove((void *)((long)in_R8 + local_38 * 2),in_RDI + local_40,
                        (in_RSI - local_40) * 2);
                local_38 = (in_RSI - local_40) + local_38;
              }
              else if (local_48 < in_RCX) {
                memmove((void *)((long)in_R8 + local_38 * 2),in_RDX + local_48,
                        (in_RCX - local_48) * 2);
                local_38 = (in_RCX - local_48) + local_38;
              }
              return local_38;
            }
            local_4a = in_RDI[local_40];
            local_4c = in_RDX[uVar1];
          }
          local_48 = local_48 + 1;
        }
        local_38 = local_38 + 1;
      } while( true );
    }
    memmove(in_R8,in_RDX,in_RCX << 1);
    local_8 = in_RCX;
  }
  return local_8;
}

Assistant:

size_t union_uint16(const uint16_t *set_1, size_t size_1, const uint16_t *set_2,
                    size_t size_2, uint16_t *buffer) {
    size_t pos = 0, idx_1 = 0, idx_2 = 0;

    if (0 == size_2) {
        memmove(buffer, set_1, size_1 * sizeof(uint16_t));
        return size_1;
    }
    if (0 == size_1) {
        memmove(buffer, set_2, size_2 * sizeof(uint16_t));
        return size_2;
    }

    uint16_t val_1 = set_1[idx_1], val_2 = set_2[idx_2];

    while (true) {
        if (val_1 < val_2) {
            buffer[pos++] = val_1;
            ++idx_1;
            if (idx_1 >= size_1) break;
            val_1 = set_1[idx_1];
        } else if (val_2 < val_1) {
            buffer[pos++] = val_2;
            ++idx_2;
            if (idx_2 >= size_2) break;
            val_2 = set_2[idx_2];
        } else {
            buffer[pos++] = val_1;
            ++idx_1;
            ++idx_2;
            if (idx_1 >= size_1 || idx_2 >= size_2) break;
            val_1 = set_1[idx_1];
            val_2 = set_2[idx_2];
        }
    }

    if (idx_1 < size_1) {
        const size_t n_elems = size_1 - idx_1;
        memmove(buffer + pos, set_1 + idx_1, n_elems * sizeof(uint16_t));
        pos += n_elems;
    } else if (idx_2 < size_2) {
        const size_t n_elems = size_2 - idx_2;
        memmove(buffer + pos, set_2 + idx_2, n_elems * sizeof(uint16_t));
        pos += n_elems;
    }

    return pos;
}